

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void handleSystemIncludesDep
               (cmLocalGenerator *lg,cmGeneratorTarget *depTgt,string *config,
               cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result,bool excludeImported,string *language)

{
  bool bVar1;
  char *pcVar2;
  pointer pcVar3;
  string *psVar4;
  undefined1 local_110 [16];
  undefined8 uStack_100;
  undefined1 local_f0 [8];
  cmGeneratorExpression ge_1;
  string local_d8;
  char *local_b8;
  char *dirs_1;
  cmListFileBacktrace local_a8;
  undefined1 local_90 [8];
  cmGeneratorExpression ge;
  allocator<char> local_69;
  string local_68;
  char *local_48;
  char *dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  bool excludeImported_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  cmGeneratorTarget *depTgt_local;
  cmLocalGenerator *lg_local;
  
  dirs._7_1_ = excludeImported;
  pvStack_38 = result;
  result_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)dagChecker;
  dagChecker_local = (cmGeneratorExpressionDAGChecker *)headTarget;
  headTarget_local = (cmGeneratorTarget *)config;
  config_local = (string *)depTgt;
  depTgt_local = (cmGeneratorTarget *)lg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_69);
  pcVar2 = cmGeneratorTarget::GetProperty(depTgt,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_48 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_a8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_a8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_a8);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_90,&local_a8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_a8);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&dirs_1,local_90);
    pcVar3 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&dirs_1);
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar3,(cmLocalGenerator *)depTgt_local,(string *)headTarget_local,false,
                        (cmGeneratorTarget *)dagChecker_local,(cmGeneratorTarget *)config_local,
                        (cmGeneratorExpressionDAGChecker *)result_local,language);
    cmSystemTools::ExpandListArgument(psVar4,pvStack_38,false);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&dirs_1);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_90);
  }
  bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)config_local);
  psVar4 = config_local;
  if ((bVar1) && ((dirs._7_1_ & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"INTERFACE_INCLUDE_DIRECTORIES",
               (allocator<char> *)
               ((long)&ge_1.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    pcVar2 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)psVar4,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ge_1.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    if (pcVar2 != (char *)0x0) {
      local_110._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uStack_100 = 0;
      local_b8 = pcVar2;
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)(local_110 + 8));
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_f0,(cmListFileBacktrace *)(local_110 + 8));
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_110 + 8));
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_110,local_f0);
      pcVar3 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)local_110);
      psVar4 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar3,(cmLocalGenerator *)depTgt_local,(string *)headTarget_local,false,
                          (cmGeneratorTarget *)dagChecker_local,(cmGeneratorTarget *)config_local,
                          (cmGeneratorExpressionDAGChecker *)result_local,language);
      cmSystemTools::ExpandListArgument(psVar4,pvStack_38,false);
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)local_110);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_f0);
    }
  }
  return;
}

Assistant:

static void handleSystemIncludesDep(
  cmLocalGenerator* lg, cmGeneratorTarget const* depTgt,
  const std::string& config, cmGeneratorTarget const* headTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::string>& result, bool excludeImported,
  std::string const& language)
{
  if (const char* dirs =
        depTgt->GetProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")) {
    cmGeneratorExpression ge;
    cmSystemTools::ExpandListArgument(
      ge.Parse(dirs)->Evaluate(lg, config, false, headTarget, depTgt,
                               dagChecker, language),
      result);
  }
  if (!depTgt->IsImported() || excludeImported) {
    return;
  }

  if (const char* dirs =
        depTgt->GetProperty("INTERFACE_INCLUDE_DIRECTORIES")) {
    cmGeneratorExpression ge;
    cmSystemTools::ExpandListArgument(
      ge.Parse(dirs)->Evaluate(lg, config, false, headTarget, depTgt,
                               dagChecker, language),
      result);
  }
}